

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O2

void gen_lfsux(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 dest;
  TCGv_i64 EA;
  uintptr_t o;
  uintptr_t o_1;
  
  if (ctx->fpu_enabled == false) {
    gen_exception(ctx,7);
    return;
  }
  tcg_ctx = ctx->uc->tcg_ctx;
  dest = tcg_temp_new_i64(tcg_ctx);
  if ((ctx->opcode & 0x1f0000) != 0) {
    gen_set_access_type(ctx,0x30);
    EA = tcg_temp_new_i64(tcg_ctx);
    gen_addr_reg_index(ctx,EA);
    gen_qemu_ld32fs(ctx,dest,EA);
    set_fpr(tcg_ctx,ctx->opcode >> 0x15 & 0x1f,dest);
    tcg_gen_mov_i64_ppc64(tcg_ctx,cpu_gpr[*(ushort *)((long)&ctx->opcode + 2) & 0x1f],EA);
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(EA + (long)tcg_ctx));
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(dest + (long)tcg_ctx));
    return;
  }
  gen_inval_exception(ctx,1);
  return;
}

Assistant:

static void gen_lfdepx(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv EA;
    TCGv_i64 t0;
    CHK_SV;
    if (unlikely(!ctx->fpu_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_FPU);
        return;
    }
    gen_set_access_type(ctx, ACCESS_FLOAT);
    EA = tcg_temp_new(tcg_ctx);
    t0 = tcg_temp_new_i64(tcg_ctx);
    gen_addr_reg_index(ctx, EA);
    tcg_gen_qemu_ld_i64(tcg_ctx, t0, EA, PPC_TLB_EPID_LOAD, DEF_MEMOP(MO_Q));
    set_fpr(tcg_ctx, rD(ctx->opcode), t0);
    tcg_temp_free(tcg_ctx, EA);
    tcg_temp_free_i64(tcg_ctx, t0);
}